

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttload.c
# Opt level: O0

FT_Error tt_face_load_cmap(TT_Face face,FT_Stream stream)

{
  FT_Error local_1c;
  FT_Error error;
  FT_Stream stream_local;
  TT_Face face_local;
  
  local_1c = (*face->goto_table)(face,0x636d6170,stream,&face->cmap_size);
  if ((local_1c == 0) &&
     (local_1c = FT_Stream_ExtractFrame(stream,face->cmap_size,&face->cmap_table), local_1c != 0)) {
    face->cmap_size = 0;
  }
  return local_1c;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_load_cmap( TT_Face    face,
                     FT_Stream  stream )
  {
    FT_Error  error;


    error = face->goto_table( face, TTAG_cmap, stream, &face->cmap_size );
    if ( error )
      goto Exit;

    if ( FT_FRAME_EXTRACT( face->cmap_size, face->cmap_table ) )
      face->cmap_size = 0;

  Exit:
    return error;
  }